

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_connection.cc
# Opt level: O1

int __thiscall iqnet::ssl::Connection::shutdown(Connection *this,int __fd,int __how)

{
  uint uVar1;
  int ret;
  int extraout_EAX;
  int extraout_EAX_00;
  
  uVar1 = SSL_get_shutdown((SSL *)this->ssl);
  if (((uVar1 & 2) != 0) && (uVar1 = SSL_get_shutdown((SSL *)this->ssl), (uVar1 & 1) != 0)) {
    return uVar1;
  }
  ret = SSL_shutdown((SSL *)this->ssl);
  if (ret == 1) {
    return 1;
  }
  if (ret != 0) {
    throw_io_exception(this->ssl,ret);
    return extraout_EAX_00;
  }
  SSL_shutdown((SSL *)this->ssl);
  SSL_set_shutdown((SSL *)this->ssl,2);
  return extraout_EAX;
}

Assistant:

void ssl::Connection::shutdown()
{
  if( shutdown_recved() && shutdown_sent() )
    return;

  int ret = SSL_shutdown( ssl );
  switch( ret )
  {
    case 1:
      return;

    case 0:
      SSL_shutdown( ssl );
      SSL_set_shutdown( ssl, SSL_RECEIVED_SHUTDOWN );
      break;

    default:
      throw_io_exception( ssl, ret );
  }
}